

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O2

void __thiscall
icu_63::RuleBasedNumberFormat::parse
          (RuleBasedNumberFormat *this,UnicodeString *text,Formattable *result,
          ParsePosition *parsePosition)

{
  double number;
  int iVar1;
  NFRuleSet *this_00;
  UBool UVar2;
  undefined4 uVar3;
  Type TVar4;
  int iVar5;
  NFRuleSet **ppNVar6;
  double dVar7;
  ParsePosition high_pp;
  ParsePosition working_pp;
  ParsePosition workingPos;
  UnicodeString workingText;
  Formattable high_result;
  Formattable working_result;
  
  if (this->fRuleSets == (NFRuleSet **)0x0) {
    parsePosition->errorIndex = 0;
  }
  else {
    UnicodeString::UnicodeString(&workingText,text,parsePosition->index);
    workingPos.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003aa3b0;
    workingPos.index = 0;
    workingPos.errorIndex = -1;
    high_pp.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003aa3b0;
    high_pp.index = 0;
    high_pp.errorIndex = -1;
    Formattable::Formattable(&high_result);
    for (ppNVar6 = this->fRuleSets; this_00 = *ppNVar6, this_00 != (NFRuleSet *)0x0;
        ppNVar6 = ppNVar6 + 1) {
      if ((this_00->fIsPublic != '\0') && (this_00->fIsParseable != '\0')) {
        working_pp.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003aa3b0;
        working_pp.index = 0;
        working_pp.errorIndex = -1;
        Formattable::Formattable(&working_result);
        NFRuleSet::parse(this_00,&workingText,&working_pp,17592186044416.0,0,&working_result);
        if (high_pp.index < working_pp.index) {
          high_pp.index = working_pp.index;
          high_pp.errorIndex = working_pp.errorIndex;
          Formattable::operator=(&high_result,&working_result);
          uVar3 = workingText.fUnion.fFields.fLength;
          if (-1 < workingText.fUnion.fStackFields.fLengthAndFlags) {
            uVar3 = (int)workingText.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          if (high_pp.index == uVar3) {
            Formattable::~Formattable(&working_result);
            ParsePosition::~ParsePosition(&working_pp);
            break;
          }
        }
        Formattable::~Formattable(&working_result);
        ParsePosition::~ParsePosition(&working_pp);
      }
    }
    iVar1 = parsePosition->index;
    parsePosition->index = high_pp.index + iVar1;
    if (high_pp.index < 1) {
      iVar5 = 0;
      if (0 < high_pp.errorIndex) {
        iVar5 = high_pp.errorIndex;
      }
      iVar5 = iVar5 + iVar1;
    }
    else {
      iVar5 = -1;
    }
    parsePosition->errorIndex = iVar5;
    Formattable::operator=(result,&high_result);
    TVar4 = Formattable::getType(result);
    if (TVar4 == kDouble) {
      number = (result->fValue).fDouble;
      UVar2 = uprv_isNaN_63(number);
      if (((UVar2 == '\0') && (dVar7 = uprv_trunc_63(number), number <= 2147483647.0)) &&
         (-2147483648.0 <= number)) {
        if ((number == dVar7) && (!NAN(number) && !NAN(dVar7))) {
          Formattable::setLong(result,(int)number);
        }
      }
    }
    Formattable::~Formattable(&high_result);
    ParsePosition::~ParsePosition(&high_pp);
    ParsePosition::~ParsePosition(&workingPos);
    UnicodeString::~UnicodeString(&workingText);
  }
  return;
}

Assistant:

void
RuleBasedNumberFormat::parse(const UnicodeString& text,
                             Formattable& result,
                             ParsePosition& parsePosition) const
{
    if (!fRuleSets) {
        parsePosition.setErrorIndex(0);
        return;
    }

    UnicodeString workingText(text, parsePosition.getIndex());
    ParsePosition workingPos(0);

    ParsePosition high_pp(0);
    Formattable high_result;

    for (NFRuleSet** p = fRuleSets; *p; ++p) {
        NFRuleSet *rp = *p;
        if (rp->isPublic() && rp->isParseable()) {
            ParsePosition working_pp(0);
            Formattable working_result;

            rp->parse(workingText, working_pp, kMaxDouble, 0, working_result);
            if (working_pp.getIndex() > high_pp.getIndex()) {
                high_pp = working_pp;
                high_result = working_result;

                if (high_pp.getIndex() == workingText.length()) {
                    break;
                }
            }
        }
    }

    int32_t startIndex = parsePosition.getIndex();
    parsePosition.setIndex(startIndex + high_pp.getIndex());
    if (high_pp.getIndex() > 0) {
        parsePosition.setErrorIndex(-1);
    } else {
        int32_t errorIndex = (high_pp.getErrorIndex()>0)? high_pp.getErrorIndex(): 0;
        parsePosition.setErrorIndex(startIndex + errorIndex);
    }
    result = high_result;
    if (result.getType() == Formattable::kDouble) {
        double d = result.getDouble();
        if (!uprv_isNaN(d) && d == uprv_trunc(d) && INT32_MIN <= d && d <= INT32_MAX) {
            // Note: casting a double to an int when the double is too large or small
            //       to fit the destination is undefined behavior. The explicit range checks,
            //       above, are required. Just casting and checking the result value is undefined.
            result.setLong(static_cast<int32_t>(d));
        }
    }
}